

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O1

int wally_confidential_addr_from_addr_segwit
              (char *address,char *addr_family,char *confidential_addr_family,uchar *pub_key,
              size_t pub_key_len,char **output)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  uint64_t uVar8;
  ulong uVar9;
  byte *pbVar10;
  size_t sVar11;
  uchar buf [65];
  char result [1001];
  uint8_t data [1000];
  size_t local_870;
  char **local_868;
  size_t local_860;
  uint8_t local_858 [31];
  uchar local_839 [49];
  byte local_808 [1008];
  byte local_418 [1000];
  
  local_870 = 0x22;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((pub_key_len != 0x21 || output == (char **)0x0) ||
      ((pub_key == (uchar *)0x0 || confidential_addr_family == (char *)0x0) ||
      (addr_family == (char *)0x0 || address == (char *)0x0))) {
    return -2;
  }
  local_868 = output;
  sVar3 = strlen(confidential_addr_family);
  if (999 < sVar3) {
    return -2;
  }
  iVar2 = wally_addr_segwit_to_bytes(address,addr_family,0,local_839,0x22,&local_870);
  sVar1 = local_870;
  if ((iVar2 == 0) && ((local_870 == 0x22 || (iVar2 = -2, local_870 == 0x16)))) {
    memcpy(local_858,pub_key,pub_key_len);
    local_870 = sVar1 + 0x1f;
    local_860 = 0;
    if ((sVar1 - 0x23 < 0xffffffffffffffc0) || (local_870 != 0x35 && local_870 != 0x41)) {
      wally_clear_2(local_418,1000,local_858,local_870);
    }
    else {
      local_418[0] = 0;
      blech32_convert_bits((uint8_t *)((long)local_418 + 1),&local_860,5,local_858,local_870,8,1);
      sVar11 = local_860;
      sVar1 = local_860 + 1;
      uVar8 = 1;
      local_860 = sVar1;
      for (lVar5 = 0; bVar7 = confidential_addr_family[lVar5], bVar7 != 0; lVar5 = lVar5 + 1) {
        if (0xe5 < (byte)(bVar7 + 0xa5) || 0x5d < (byte)(bVar7 - 0x21)) goto LAB_00103ac6;
        uVar8 = blech32_polymod_step(uVar8);
        uVar8 = bVar7 >> 5 ^ uVar8;
      }
      if (sVar11 + lVar5 + 0xe < 0x3e9) {
        uVar8 = blech32_polymod_step(uVar8);
        bVar7 = *confidential_addr_family;
        if (bVar7 == 0) {
          pbVar6 = local_808;
        }
        else {
          pbVar10 = (byte *)(confidential_addr_family + 1);
          pbVar6 = local_808;
          do {
            uVar8 = blech32_polymod_step(uVar8);
            *pbVar6 = bVar7;
            uVar8 = bVar7 & 0x1f ^ uVar8;
            pbVar6 = pbVar6 + 1;
            bVar7 = *pbVar10;
            pbVar10 = pbVar10 + 1;
          } while (bVar7 != 0);
        }
        *pbVar6 = 0x31;
        pbVar6 = pbVar6 + 1;
        if (sVar1 != 0) {
          sVar11 = 0;
          do {
            uVar9 = (ulong)local_418[sVar11];
            if (0x1f < uVar9) goto LAB_00103ac6;
            uVar8 = blech32_polymod_step(uVar8);
            uVar8 = uVar8 ^ uVar9;
            pbVar6[sVar11] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[uVar9];
            sVar11 = sVar11 + 1;
          } while (sVar1 != sVar11);
          pbVar6 = pbVar6 + sVar11;
        }
        lVar5 = 0xc;
        do {
          uVar8 = blech32_polymod_step(uVar8);
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
        lVar5 = 0x37;
        do {
          *pbVar6 = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"
                    [(uint)((uVar8 ^ 1) >> ((byte)lVar5 & 0x3f)) & 0x1f];
          pbVar6 = pbVar6 + 1;
          lVar5 = lVar5 + -5;
        } while (lVar5 != -5);
        *pbVar6 = 0;
        pcVar4 = wally_strdup((char *)local_808);
        *local_868 = pcVar4;
        iVar2 = (uint)(pcVar4 != (char *)0x0) * 3 + -3;
        goto LAB_00103999;
      }
    }
LAB_00103ac6:
    iVar2 = -1;
  }
  else {
LAB_00103999:
    wally_clear(local_858,0x41);
    wally_clear(local_808,0x3e9);
  }
  return iVar2;
}

Assistant:

int wally_confidential_addr_from_addr_segwit(
    const char *address,
    const char *addr_family,
    const char *confidential_addr_family,
    const unsigned char *pub_key,
    size_t pub_key_len,
    char **output)
{
    char result[WALLY_BLECH32_MAXLEN + 1];
    unsigned char buf[EC_PUBLIC_KEY_LEN + SHA256_LEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = SHA256_LEN + 2;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !addr_family || !confidential_addr_family || !pub_key ||
        pub_key_len != EC_PUBLIC_KEY_LEN || !output ||
        strlen(confidential_addr_family) >= WALLY_BLECH32_MAXLEN)
        return WALLY_EINVAL;

    /* get v0 witness programs script */
    ret = wally_addr_segwit_to_bytes(address, addr_family, 0,
                                     hash_bytes_p, written, &written);
    if (ret == WALLY_OK) {
        if ((written != (HASH160_LEN + 2)) && (written != (SHA256_LEN + 2)))
            ret = WALLY_EINVAL;
        else {
            /* Copy the confidentialKey / v0 witness programs */
            memcpy(buf, pub_key, pub_key_len);
            written -= 2;   /* ignore witnessVersion & hashSize */
            written += EC_PUBLIC_KEY_LEN;
            if (!blech32_addr_encode(result, confidential_addr_family, 0, buf, written))
                return WALLY_ERROR;

            *output = wally_strdup(result);
            ret = (*output) ? WALLY_OK : WALLY_ENOMEM;
        }
    }

    wally_clear(buf, sizeof(buf));
    wally_clear(result, sizeof(result));
    return ret;
}